

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O2

void __thiscall fmcalc::init_profile(fmcalc *this)

{
  FILE *__stream;
  size_t sVar1;
  string file;
  fm_profile f;
  undefined1 local_50 [32];
  undefined8 uStack_30;
  
  std::__cxx11::string::string((string *)&file,"input/fm_profile.bin",(allocator *)&f);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &this->inputpath_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    std::__cxx11::string::operator=((string *)&file,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::string::~string((string *)local_50);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    f.deductible3 = 0.0;
    f.attachment = 0.0;
    f.limit = 0.0;
    f.share1 = 0.0;
    f.profile_id = 0;
    f.calcrule_id = 0;
    f.deductible1 = 0.0;
    f.deductible2 = 0.0;
    f.share2 = 0.0;
    f.share3 = 0.0;
    while( true ) {
      sVar1 = fread(&f,0x28,1,__stream);
      if ((int)sVar1 == 0) break;
      init_profile_rec(this,&f);
      if (this->noop_profile_id < f.profile_id) {
        this->noop_profile_id = f.profile_id;
      }
    }
    local_50._0_4_ = this->noop_profile_id + 1;
    this->noop_profile_id = local_50._0_4_;
    local_50._24_8_ = 0;
    uStack_30._0_4_ = 0.0;
    uStack_30._4_4_ = 0.0;
    local_50._8_8_ = 0;
    local_50._16_8_ = 0;
    local_50._4_4_ = 100;
    init_profile_rec(this,(fm_profile *)local_50);
    fclose(__stream);
    std::__cxx11::string::~string((string *)&file);
    return;
  }
  fprintf(_stderr,"%s: cannot open %s\n","init_profile",file._M_dataplus._M_p);
  exit(1);
}

Assistant:

void fmcalc::init_profile()
{
	FILE *fin = NULL;
	std::string file = FMPROFILE_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_profile f;
	int i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {		
		init_profile_rec(f);
		if (noop_profile_id < f.profile_id) noop_profile_id = f.profile_id;
		i = fread(&f, sizeof(f), 1, fin);
	}
	noop_profile_id++;
	fm_profile d;	// dummy
	d.profile_id = noop_profile_id;
	//d.calcrule_id = 14;
	d.calcrule_id = 100; // noop
	init_profile_rec(d);
	fclose(fin);
}